

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

cbtScalar __thiscall
cbtCollisionWorld::
rayTestSingleInternal(cbtTransform_const&,cbtTransform_const&,cbtCollisionObjectWrapper_const*,cbtCollisionWorld
::RayResultCallback&)::LocalInfoAdder2::addSingleResult(cbtCollisionWorld::LocalRayResult__bool_
          (void *this,LocalRayResult *r,bool b)

{
  cbtScalar cVar1;
  LocalShapeInfo shapeInfo;
  LocalShapeInfo local_10;
  
  local_10.m_shapePart = -1;
  local_10.m_triangleIndex = *(int *)((long)this + 0x30);
  if (r->m_localShapeInfo == (LocalShapeInfo *)0x0) {
    r->m_localShapeInfo = &local_10;
  }
  cVar1 = (cbtScalar)
          (**(code **)(**(long **)((long)this + 0x28) + 0x18))(*(long **)((long)this + 0x28),r,b);
  *(undefined4 *)((long)this + 8) = *(undefined4 *)(*(long *)((long)this + 0x28) + 8);
  return cVar1;
}

Assistant:

virtual cbtScalar addSingleResult(cbtCollisionWorld::LocalRayResult& r, bool b)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = -1;
						shapeInfo.m_triangleIndex = m_i;
						if (r.m_localShapeInfo == NULL)
							r.m_localShapeInfo = &shapeInfo;

						const cbtScalar result = m_userCallback->addSingleResult(r, b);
						m_closestHitFraction = m_userCallback->m_closestHitFraction;
						return result;
					}